

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGenerator.cpp
# Opt level: O2

void __thiscall
Js::JavascriptGenerator::MarkVisitKindSpecificPtrs
          (JavascriptGenerator *this,SnapshotExtractor *extractor)

{
  ScriptFunction *var;
  InterpreterStackFrame *pIVar1;
  ArgSlot AVar2;
  RegSlot RVar3;
  Var pvVar4;
  ulong uVar5;
  uint32 i;
  uint idxArg;
  
  var = (this->scriptFunction).ptr;
  if (var != (ScriptFunction *)0x0) {
    TTD::SnapshotExtractor::MarkVisitVar(extractor,var);
  }
  pIVar1 = (this->frame).ptr;
  if (pIVar1 != (InterpreterStackFrame *)0x0) {
    RVar3 = FunctionBody::GetLocalsCount(*(FunctionBody **)(pIVar1 + 0x88));
    for (uVar5 = 0; RVar3 != uVar5; uVar5 = uVar5 + 1) {
      pvVar4 = *(Var *)((this->frame).ptr + uVar5 * 8 + 0x160);
      if (pvVar4 != (Var)0x0) {
        TTD::SnapshotExtractor::MarkVisitVar(extractor,pvVar4);
      }
    }
  }
  if ((this->args).Values != (Type)0x0) {
    AVar2 = CallInfo::GetArgCountWithExtraArgs(&(this->args).Info);
    for (idxArg = 0; AVar2 != idxArg; idxArg = idxArg + 1) {
      pvVar4 = Arguments::operator[](&this->args,idxArg);
      if (pvVar4 != (Var)0x0) {
        TTD::SnapshotExtractor::MarkVisitVar(extractor,pvVar4);
      }
    }
  }
  return;
}

Assistant:

void JavascriptGenerator::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
{
    if (this->scriptFunction != nullptr)
    {
        extractor->MarkVisitVar(this->scriptFunction);
    }

    // frame is null when generator has been completed
    if (this->frame != nullptr)
    {
        // mark slot variables for traversal
        Js::RegSlot slotCount = this->frame->GetFunctionBody()->GetLocalsCount();
        for (Js::RegSlot i = 0; i < slotCount; i++)
        {
            Js::Var curr = this->frame->m_localSlots[i];
            if (curr != nullptr)
            {
                extractor->MarkVisitVar(curr);
            }
        }
    }

    // args.Values is null when generator has been completed
    if (this->args.Values != nullptr)
    {
        // mark argument variables for traversal
        uint32 argCount = this->args.GetArgCountWithExtraArgs();
        for (uint32 i = 0; i < argCount; i++)
        {
            Js::Var curr = this->args[i];
            if (curr != nullptr)
            {
                extractor->MarkVisitVar(curr);
            }
        }
    }
}